

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O0

void CMU462::Viewer::cursor_callback(GLFWwindow *window,double xpos,double ypos)

{
  float cursor_y_1;
  float cursor_x_1;
  float cursor_y;
  float cursor_x;
  double ypos_local;
  double xpos_local;
  GLFWwindow *window_local;
  
  if ((HDPI & 1) == 0) {
    (**(code **)(*renderer + 0x38))((float)xpos,(float)ypos);
  }
  else {
    (**(code **)(*renderer + 0x38))((float)(xpos * 2.0),(float)(ypos * 2.0));
  }
  return;
}

Assistant:

void Viewer::cursor_callback( GLFWwindow* window, double xpos, double ypos ) {

  // forward pan event to renderer
  if( HDPI ) {
    float cursor_x = 2 * xpos;
    float cursor_y = 2 * ypos;
    renderer->cursor_event(cursor_x, cursor_y);
  } else {
    float cursor_x = xpos;
    float cursor_y = ypos;
    renderer->cursor_event(cursor_x, cursor_y);
  }

}